

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O0

void extractLikeEnv(Classification *result,string *c,size_t *i)

{
  size_t sVar1;
  string local_40 [32];
  size_t *local_20;
  size_t *i_local;
  string *c_local;
  Classification *result_local;
  
  local_20 = i;
  i_local = (size_t *)c;
  c_local = (string *)result;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_40,(ulong)c);
  std::__cxx11::string::operator=((string *)&c_local[1]._M_string_length,local_40);
  std::__cxx11::string::~string(local_40);
  sVar1 = std::__cxx11::string::size();
  *local_20 = sVar1;
  return;
}

Assistant:

void extractLikeEnv (Classification &result, string &c, size_t &i) {
    result.behavesLike = c.substr(i, c.size() - i);
    i = c.size();
}